

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O1

int Aig_ManSuppCharCommon(uint *pBuffer,Vec_Int_t *vOne)

{
  int iVar1;
  long lVar2;
  
  if (0 < (long)vOne->nSize) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (uint)((pBuffer[vOne->pArray[lVar2] >> 5] >> (vOne->pArray[lVar2] & 0x1fU) & 1
                             ) != 0);
      lVar2 = lVar2 + 1;
    } while (vOne->nSize != lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int Aig_ManSuppCharCommon( unsigned * pBuffer, Vec_Int_t * vOne )
{
    int i, Entry, nCommon = 0;
    Vec_IntForEachEntry( vOne, Entry, i )
        nCommon += Abc_InfoHasBit(pBuffer, Entry);
    return nCommon;
}